

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O2

void test_bson_iso8601_local(void)

{
  test_date_io("1971-02-03T09:16:06.789+0511","1971-02-03T04:05:06.789Z",0x802837065);
  test_date_io("1971-02-03T09:16:06.78+0511","1971-02-03T04:05:06.780Z",0x80283705c);
  test_date_io("1971-02-03T09:16:06.7+0511","1971-02-03T04:05:06.700Z",0x80283700c);
  test_date_io("1971-02-03T09:16:06+0511","1971-02-03T04:05:06Z",0x802836d50);
  test_date_io("1971-02-03T09:16+0511","1971-02-03T04:05:00Z",0x8028355e0);
  test_date_io("1970-01-01T00:00:00.000Z","1970-01-01T00:00:00Z",0);
  test_date_rt("1970-06-30T01:06:40.981Z",0x39f35bcd5);
  test_date_io("1970-06-29T21:06:40.981-0400","1970-06-30T01:06:40.981Z",0x39f35bcd5);
  test_date_io("1969-12-31T16:00:00.000-0800","1970-01-01T00:00:00Z",0);
  test_date_io("2058-02-20T13:29:11.100-0500","2058-02-20T18:29:11.100Z",0x2879ba87d3c);
  test_date_rt("3000-12-31T23:59:59Z",0x1d9731fe0818);
  test_date_io("2013-02-20T13:29:11.100-0500","2013-02-20T18:29:11.100Z",0x13cf8ddcd3c);
  test_date_io("2013-02-20T13:29:11.100-0501","2013-02-20T18:30:11.100Z",0x13cf8deb79c);
  test_date("0000-01-01T00:00:00.000Z",-0x388a6f046000);
  test_date("0000-01-01T00:00:00.000+2300",-0x388a73f3cd80);
  test_date("9999-01-01T00:00:00.000Z",0xe6707a6eb000);
  return;
}

Assistant:

static void
test_bson_iso8601_local (void)
{
   /* Allowed date format:
    * YYYY-MM-DDTHH:MM[:SS[.m[m[m]]]]+HHMM
    * Year, month, day, hour, and minute are required, while the seconds
    * component and one to
    * three milliseconds are optional.  The time zone offset must be four
    * digits.
    */

   test_date_io ("1971-02-03T09:16:06.789+0511",
                 "1971-02-03T04:05:06.789Z",
                 34401906789ULL);
   test_date_io ("1971-02-03T09:16:06.78+0511",
                 "1971-02-03T04:05:06.780Z",
                 34401906780ULL);
   test_date_io (
      "1971-02-03T09:16:06.7+0511", "1971-02-03T04:05:06.700Z", 34401906700ULL);
   test_date_io (
      "1971-02-03T09:16:06+0511", "1971-02-03T04:05:06Z", 34401906000ULL);
   test_date_io (
      "1971-02-03T09:16+0511", "1971-02-03T04:05:00Z", 34401900000ULL);
   test_date_io ("1970-01-01T00:00:00.000Z", "1970-01-01T00:00:00Z", 0ULL);
   test_date_rt ("1970-06-30T01:06:40.981Z", 15556000981ULL);
   test_date_io ("1970-06-29T21:06:40.981-0400",
                 "1970-06-30T01:06:40.981Z",
                 15556000981ULL);
   test_date_io ("1969-12-31T16:00:00.000-0800", "1970-01-01T00:00:00Z", 0ULL);

   if (!IS_TIME_T_SMALL) {
      test_date_io ("2058-02-20T13:29:11.100-0500",
                    "2058-02-20T18:29:11.100Z",
                    2781455351100ULL);
      test_date_rt ("3000-12-31T23:59:59Z", 32535215999000ULL);
   } else {
      test_date_rt ("2038-01-19T03:14:07Z", 2147483647000ULL);
   }

   test_date_io ("2013-02-20T13:29:11.100-0500",
                 "2013-02-20T18:29:11.100Z",
                 1361384951100ULL);
   test_date_io ("2013-02-20T13:29:11.100-0501",
                 "2013-02-20T18:30:11.100Z",
                 1361385011100ULL);
   test_date ("0000-01-01T00:00:00.000Z", -62167219200000LL);
   test_date ("0000-01-01T00:00:00.000+2300", -62167302000000LL);
   test_date ("9999-01-01T00:00:00.000Z", 253370764800000ULL);
}